

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O3

bool __thiscall Threading::Event::_Wait(Event *this,TimeOut *rcxTO)

{
  int iVar1;
  ulong uVar2;
  Event EVar3;
  long lVar4;
  long lVar5;
  timespec abstime;
  timeval now;
  timespec local_58;
  timeval local_48;
  timeval local_38;
  
  if (rcxTO->duration == 0) {
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)this);
    if (iVar1 != 0) {
      return false;
    }
    EVar3 = this[0x29];
    if ((this[0x29] == (Event)0x1) && (this[0x28] == (Event)0x0)) {
      this[0x29] = (Event)0x0;
    }
  }
  else {
    if (rcxTO->duration == 0xffffffff) {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
      if (iVar1 != 0) {
        return false;
      }
      if (this[0x29] == (Event)0x0) {
        do {
          while (iVar1 = pthread_cond_wait((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this),
                iVar1 != 0) {
            if (iVar1 != 4) goto LAB_00112dfb;
          }
        } while (this[0x29] != (Event)0x1);
      }
    }
    else {
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      uVar2 = (ulong)((rcxTO->duration % 1000) * 1000);
      lVar5 = local_38.tv_usec + uVar2;
      lVar4 = local_38.tv_usec + -1000000 + uVar2;
      if (lVar5 < 0xf4241) {
        lVar4 = lVar5;
      }
      lVar5 = (ulong)(1000000 < lVar5) + (ulong)rcxTO->duration / 1000 + local_38.tv_sec;
      local_58.tv_nsec = lVar4 * 1000;
      local_58.tv_sec = lVar5;
      while( true ) {
        gettimeofday(&local_48,(__timezone_ptr_t)0x0);
        if ((lVar5 <= local_48.tv_sec) && (lVar4 <= local_48.tv_usec)) {
          return false;
        }
        iVar1 = pthread_mutex_trylock((pthread_mutex_t *)this);
        if (iVar1 == 0) break;
        sched_yield();
      }
      if (this[0x29] == (Event)0x0) {
        iVar1 = 4;
        do {
          while (iVar1 != 0) {
            if (iVar1 != 4) goto LAB_00112dfb;
            iVar1 = pthread_cond_timedwait
                              ((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this,&local_58);
          }
          iVar1 = 4;
        } while (this[0x29] != (Event)0x1);
      }
    }
    EVar3 = (Event)0x1;
    if (this[0x28] == (Event)0x0) {
      this[0x29] = (Event)0x0;
      EVar3 = (Event)0x1;
    }
  }
LAB_00112dfd:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)EVar3;
LAB_00112dfb:
  EVar3 = (Event)0x0;
  goto LAB_00112dfd;
}

Assistant:

bool Threading::Event::_Wait(const TimeOut & rcxTO) volatile
{
  #ifndef _POSIX
    bool isOkay = false;
    // compute time delay
    portTickType  tickDelay = rcxTO == Infinite ? portMAX_DELAY : (rcxTO == InstantCheck ? 0 : rcxTO / portTICK_RATE_MS);
    portBASE_TYPE  result;
    unsigned portLONG ulVar = 0;

    // The value in the queue must be removed
    if (!manualReset)
    {
        // The queue is automatically freed
        return xQueueReceive(xQueue, &ulVar, tickDelay) == pdTRUE;
    }
    // The queue is not automatically freed
    return xQueuePeek(xQueue, &ulVar, tickDelay) == pdTRUE;
  #else
    bool isOkay = false;
    if (rcxTO == Infinite)
    {
        bool bState = false;
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = pthread_mutex_lock((HMUTEX*)&event), retValue = 0;
        if (mutexLockSuccess == 0)
        {
            bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    // pthread_cond_wait release the mxEvent mutex and
                    // lock the condition atomically
                    // Because if any other thread wants to modify the state
                    // it has to lock the mutex, the change will be protected then
                    if ((retValue = pthread_cond_wait((pthread_cond_t*)&condition, (HMUTEX*)&event)) == EINTR) continue;
                    if (retValue != 0)
                    {   // An error occurred
                        isOkay = false; break;
                    }
                    bState = state;
                }

                if (!retValue)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }

        } // else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
    else if (rcxTO == InstantCheck)
    {
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int retValue = pthread_mutex_trylock((HMUTEX*)&event);
        if (retValue == 0)
        {
            isOkay = state;
            // Is it in auto reset mode ?
            if (state && !manualReset) state = false;

        } //else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(retValue == 0);
        return isOkay;
    }
    else // Wait with time out
    {
        // Process the absolute time for timeout
        struct timespec abstime;
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)(rcxTO % 1000) * 1000;
        tOut.tv_sec += (uint32)rcxTO / 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }
        abstime.tv_sec = tOut.tv_sec;
        abstime.tv_nsec = tOut.tv_usec * 1000;

        // First try to lock the mutex
        // Sadly, we must poll here

        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = -1, retval = 0;
        // Poll to get the mutex
        while (stillBefore(&tOut))
        {
            mutexLockSuccess = pthread_mutex_trylock((HMUTEX*)&event);
            if (mutexLockSuccess == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid polling)
            sched_yield();
        }
        if (mutexLockSuccess == 0)
        {   // We now have the mutex, so check the state
            bool bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {   // Unset here, so wait for the condition
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    retval = EINTR;
                    while (retval == EINTR) retval = pthread_cond_timedwait((pthread_cond_t*)&condition, (HMUTEX*)&event, &abstime);

                    if (retval != 0) //== ETIMEDOUT)
                    {   // No change in the specified time, so release the mutex and return
                        break;
                    }

                    // A thread could have reset a unset state, thus causing condition
                    // broadcasting. We have to make sure the state is good now
                    bState = state;
                }

                if (!retval)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }
        }
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
  #endif
}